

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                *matrix)

{
  bool bVar1;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4b0;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_498;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col3;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col2;
  Column_settings settings;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col1;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col0;
  
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  col1.super_Column_dimension_option.dim_ = 0;
  col1._4_4_ = 4;
  col1.column_._M_h._M_buckets._0_4_ = 1;
  col1.column_._M_h._M_buckets._4_4_ = 2;
  col1.column_._M_h._M_bucket_count._0_4_ = 2;
  col1.column_._M_h._M_bucket_count._4_4_ = 1;
  col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 5;
  col1.column_._M_h._M_before_begin._M_nxt._4_4_ = 1;
  col1.column_._M_h._M_element_count = 0x100000006;
  __l._M_len = 5;
  __l._M_array = (iterator)&col1;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col2,__l,(allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  Unordered_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)&col0,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col2,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col2);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0);
  col1.column_._M_h._M_bucket_count._0_4_ = 0;
  col1.column_._M_h._M_bucket_count._4_4_ = 0;
  col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 1;
  col1.super_Column_dimension_option.dim_ = 0;
  col1._4_4_ = 4;
  col1.column_._M_h._M_buckets._0_4_ = 1;
  col1.column_._M_h._M_buckets._4_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col1);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x386);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,&veccont);
  col2.super_Column_dimension_option.dim_._0_1_ = bVar1;
  col2.column_._M_h._M_buckets._0_4_ = 0;
  col2.column_._M_h._M_buckets._4_4_ = 0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col1.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&col4;
  col4._0_8_ = anon_var_dwarf_51e88;
  col4.column_._M_h._M_buckets._0_4_ = 0x167e89;
  col4.column_._M_h._M_buckets._4_4_ = 0;
  col1.column_._M_h._M_buckets._0_4_ = (uint)col1.column_._M_h._M_buckets & 0xffffff00;
  col1._0_8_ = &PTR__lazy_ostream_0018f7e0;
  col1.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col1.column_._M_h._M_bucket_count._4_4_ = 0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col2.column_._M_h._M_bucket_count);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col3);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x388);
  col1.column_._M_h._M_buckets._0_4_ = (uint)col1.column_._M_h._M_buckets & 0xffffff00;
  col1._0_8_ = &PTR__lazy_ostream_0018f7a0;
  col1.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col1.column_._M_h._M_bucket_count._4_4_ = 0;
  col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x16325b;
  col1.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  col2._0_8_ = (((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->column_)._M_h._M_element_count;
  col3.super_Column_dimension_option.dim_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col1,&local_e0,0x388,1,2,&col2,"matrix[0].size()",&col3,"4");
  col2.super_Column_dimension_option.dim_ = 0;
  col2._4_4_ = 1;
  col2.column_._M_h._M_buckets._0_4_ = 1;
  col2.column_._M_h._M_buckets._4_4_ = 3;
  col2.column_._M_h._M_bucket_count._0_4_ = 2;
  col2.column_._M_h._M_bucket_count._4_4_ = 4;
  col2.column_._M_h._M_before_begin._M_nxt._0_4_ = 5;
  col2.column_._M_h._M_before_begin._M_nxt._4_4_ = 4;
  col2.column_._M_h._M_element_count = 0x400000006;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col3,__l_00,(allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  Unordered_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)&col1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col3);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x38f);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&veccont);
  col3.super_Column_dimension_option.dim_._0_1_ = bVar1;
  col3.column_._M_h._M_buckets._0_4_ = 0;
  col3.column_._M_h._M_buckets._4_4_ = 0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x167e9d;
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x167ecd;
  local_498._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.column_._M_h._M_buckets._0_4_ = (uint)col2.column_._M_h._M_buckets & 0xffffff00;
  col2._0_8_ = &PTR__lazy_ostream_0018f7e0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&local_498;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col3.column_._M_h._M_bucket_count);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col4);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x391);
  col2.column_._M_h._M_buckets._0_4_ = (uint)col2.column_._M_h._M_buckets & 0xffffff00;
  col2._0_8_ = &PTR__lazy_ostream_0018f7a0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x16325b;
  col2.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  col3._0_8_ = (matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].column_._M_h._M_element_count;
  col4._0_8_ = col4._0_8_ & 0xffffffff00000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col2,&local_140,0x391,1,2,&col3,"matrix[1].size()",&col4,"0");
  col2.super_Column_dimension_option.dim_ = 4;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&col2,&col1);
  col2.column_._M_h._M_bucket_count._0_4_ = 0;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt._0_4_ = 4;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._4_4_ = 1;
  col2.column_._M_h._M_buckets._0_4_ = 4;
  col2.column_._M_h._M_buckets._4_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col2);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x397);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 4,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&veccont);
  col3.super_Column_dimension_option.dim_._0_1_ = bVar1;
  col3.column_._M_h._M_buckets._0_4_ = 0;
  col3.column_._M_h._M_buckets._4_4_ = 0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x167edf;
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x167f0f;
  local_498._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.column_._M_h._M_buckets._0_4_ = (uint)col2.column_._M_h._M_buckets & 0xffffff00;
  col2._0_8_ = &PTR__lazy_ostream_0018f7e0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_168 = "";
  col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&local_498;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col3.column_._M_h._M_bucket_count);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col4);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x399);
  col2.column_._M_h._M_buckets._0_4_ = (uint)col2.column_._M_h._M_buckets & 0xffffff00;
  col2._0_8_ = &PTR__lazy_ostream_0018f7a0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x16325b;
  col2.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  col3._0_8_ = (matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[4].column_._M_h._M_element_count;
  col4.super_Column_dimension_option.dim_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col2,&local_1a0,0x399,1,2,&col3,"matrix[4].size()",&col4,"4");
  col3.super_Column_dimension_option.dim_ = 0;
  col3._4_4_ = 0;
  col3.column_._M_h._M_buckets._0_4_ = 0;
  col3.column_._M_h._M_buckets._4_4_ = 0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  Unordered_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)&col2,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col3);
  col3.super_Column_dimension_option.dim_ = 3;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col2,(Field_element *)&col3);
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 1;
  col3.column_._M_h._M_before_begin._M_nxt._0_4_ = 1;
  col3.super_Column_dimension_option.dim_ = 4;
  col3._4_4_ = 2;
  col3.column_._M_h._M_buckets._0_4_ = 1;
  col3.column_._M_h._M_buckets._4_4_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col3);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x39f);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_498,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_498,&veccont
                         );
  col4.super_Column_dimension_option.dim_._0_1_ = bVar1;
  col4.column_._M_h._M_buckets._0_4_ = 0;
  col4.column_._M_h._M_buckets._4_4_ = 0;
  col4.column_._M_h._M_bucket_count._0_4_ = 0;
  col4.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&local_4b0;
  local_4b0._M_impl.super__Vector_impl_data._M_start = (pointer)0x167f21;
  local_4b0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x167f51;
  col3.column_._M_h._M_buckets._0_4_ = (uint)col3.column_._M_h._M_buckets & 0xffffff00;
  col3._0_8_ = &PTR__lazy_ostream_0018f7e0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_498);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x3a0);
  col3.column_._M_h._M_buckets._0_4_ = (uint)col3.column_._M_h._M_buckets & 0xffffff00;
  col3._0_8_ = &PTR__lazy_ostream_0018f7a0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x16325b;
  col3.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  col4._0_8_ = (matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  local_498._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_498._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col3,&local_200,0x3a0,1,2,&col4,"matrix[5].size()",&local_498,"5");
  col4.super_Column_dimension_option.dim_ = 0;
  col4._4_4_ = 3;
  col4.column_._M_h._M_buckets._0_4_ = 2;
  col4.column_._M_h._M_buckets._4_4_ = 1;
  col4.column_._M_h._M_bucket_count._0_4_ = 3;
  col4.column_._M_h._M_bucket_count._4_4_ = 2;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 5;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 2;
  col4.column_._M_h._M_element_count = 0x100000006;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&col4;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_498,__l_01,(allocator_type *)&local_4b0);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  Unordered_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)&col3,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_498,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_498);
  col4.super_Column_dimension_option.dim_ = 3;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col3,(Field_element *)&col4);
  col4.column_._M_h._M_bucket_count._0_4_ = 0;
  col4.column_._M_h._M_bucket_count._4_4_ = 2;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 4;
  col4.super_Column_dimension_option.dim_ = 3;
  col4._4_4_ = 2;
  col4.column_._M_h._M_buckets._0_4_ = 4;
  col4.column_._M_h._M_buckets._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col4);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x3a5);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b0,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b0,&veccont
                         );
  local_498._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_498._M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col4.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&local_3c0;
  local_3c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x167f21;
  local_3c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x167f51;
  col4.column_._M_h._M_buckets._0_4_ = (uint)col4.column_._M_h._M_buckets & 0xffffff00;
  col4._0_8_ = &PTR__lazy_ostream_0018f7e0;
  col4.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col4.column_._M_h._M_bucket_count._4_4_ = 0;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_228 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_498._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b0);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x3a7);
  col4.column_._M_h._M_buckets._0_4_ = (uint)col4.column_._M_h._M_buckets & 0xffffff00;
  col4._0_8_ = &PTR__lazy_ostream_0018f7a0;
  col4.column_._M_h._M_bucket_count._0_4_ = 0x194148;
  col4.column_._M_h._M_bucket_count._4_4_ = 0;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x16325b;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_258 = "";
  local_498._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &(matrix->
         super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  local_4b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_4b0._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col4,&local_260,0x3a7,1,2,&local_498,"matrix[5].size()",&local_4b0,"6");
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000000;
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  local_498._M_impl.super__Vector_impl_data._M_finish._4_4_ = 2;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  uStack_480._0_4_ = 3;
  uStack_480._4_4_ = 1;
  local_478 = 0x200000005;
  uStack_470 = 0x400000006;
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)&local_498;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_4b0,__l_02,(allocator_type *)&local_3c0);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  Unordered_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)&col4,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_4b0,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_4b0);
  local_498._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_498._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  _multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)&local_498,&col4);
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  uStack_480._0_4_ = 4;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000003;
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
  local_498._M_impl.super__Vector_impl_data._M_finish._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_498);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x3ad);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 3,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0,&veccont
                         );
  local_4b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_4b0._M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  local_4b0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_480 = &local_290;
  local_290 = "matrix[3].get_content(veccont.size()) == veccont";
  local_288 = "";
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       (uint)local_498._M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0018f7e0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x194148;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_298 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_4b0._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3c0);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x3af);
  local_498._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       (uint)local_498._M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0018f7a0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x194148;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uStack_480._0_4_ = 0x16325b;
  uStack_480._4_4_ = 0;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2c8 = "";
  local_4b0._M_impl.super__Vector_impl_data._M_start =
       (pointer)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[3].column_._M_h._M_element_count;
  local_3c0._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3c0._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_498,&local_2d0,0x3af,1,2,&local_4b0,"matrix[3].size()",&local_3c0,"6");
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::~Unordered_set_column(&col4);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::~Unordered_set_column(&col3);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::~Unordered_set_column(&col2);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::~Unordered_set_column(&col1);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  ::~Unordered_set_column(&col0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&settings.operators.inverse_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}